

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

vector<basist::ktx2_transcoder::key_value> * __thiscall
basisu::vector<basist::ktx2_transcoder::key_value>::operator=
          (vector<basist::ktx2_transcoder::key_value> *this,
          vector<basist::ktx2_transcoder::key_value> *other)

{
  uint32_t uVar1;
  key_value *pkVar2;
  key_value *this_00;
  bool bVar3;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      increase_capacity(this,other->m_size,false,false);
    }
    else {
      resize(this,0,false);
    }
    uVar1 = other->m_size;
    pkVar2 = other->m_p;
    this_00 = this->m_p;
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      basist::ktx2_transcoder::key_value::key_value(this_00,pkVar2);
      pkVar2 = pkVar2 + 1;
      this_00 = this_00 + 1;
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }